

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

value_type __thiscall
jsoncons::jsonpath::detail::
tokenize_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
evaluate(tokenize_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
         *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *args,error_code *ec)

{
  bool bVar1;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __a;
  unsigned_long *puVar2;
  const_reference pvVar3;
  basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *this_00;
  semantic_tag *args_1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *this_01;
  vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  in_RSI;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
  *in_RDI;
  optional<unsigned_long> oVar5;
  value_type vVar6;
  string_type s;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
  rend;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
  rit;
  basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> pieces_regex;
  flag_type options;
  string_type s1;
  string_type s0;
  type arg1;
  type arg0;
  value_type *j;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
  *in_stack_fffffffffffffd48;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
  *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  jsonpath_errc in_stack_fffffffffffffd5c;
  error_code *in_stack_fffffffffffffd60;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *this_02;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffd70;
  flag_type __f;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__s;
  allocator<wchar_t> *args_00;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
  *this_03;
  wstring local_228 [39];
  undefined1 local_201;
  undefined8 local_178;
  undefined8 local_168;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
  local_158;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
  *in_stack_ffffffffffffff30;
  allocator<wchar_t> local_a9;
  wstring local_a8 [55];
  allocator<wchar_t> local_71;
  wstring local_70 [32];
  type local_50;
  type local_40;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_8
  local_30;
  vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *local_18;
  
  this_03 = in_RDI;
  local_18 = in_RDX;
  __a._M_current =
       (wchar_t *)
       std::
       vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
       ::size(in_RDX);
  oVar5 = function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::arity((function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)in_RSI._M_current);
  local_30._M_allocated_capacity =
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_30._M_local_buf[2]._0_1_ =
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x6280c9);
  if (__a._M_current == (wchar_t *)*puVar2) {
    pvVar3 = std::
             vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             ::operator[](local_18,0);
    parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::value
              (pvVar3);
    bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                      (in_stack_fffffffffffffd68);
    if (bVar1) {
      pvVar3 = std::
               vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               ::operator[](local_18,1);
      parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
      value(pvVar3);
      bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                        (in_stack_fffffffffffffd68);
      if (bVar1) {
        pvVar3 = std::
                 vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 ::operator[](local_18,0);
        parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
        value(pvVar3);
        local_40 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                   as<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                             ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *
                              )0x628196);
        pvVar3 = std::
                 vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 ::operator[](local_18,1);
        parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
        value(pvVar3);
        local_50 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
                   as<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                             ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *
                              )0x6281c8);
        __s = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
              &local_40;
        this_00 = (basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)
                  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin
                            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)__s);
        args_1 = (semantic_tag *)
                 std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::end
                           ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)__s);
        args_00 = &local_71;
        std::allocator<wchar_t>::allocator<char>
                  ((allocator<wchar_t> *)in_stack_fffffffffffffd50,
                   (allocator<char> *)in_stack_fffffffffffffd48);
        std::__cxx11::wstring::wstring<wchar_t_const*,void>
                  (in_stack_fffffffffffffd70,(wchar_t *)in_stack_fffffffffffffd68,
                   &in_stack_fffffffffffffd60->_M_value,
                   (allocator<wchar_t> *)
                   CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
        std::allocator<wchar_t>::~allocator(&local_71);
        this_02 = &local_50;
        this_01 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin(this_02);
        std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::end(this_02);
        __f = (flag_type)((ulong)&local_a9 >> 0x20);
        std::allocator<wchar_t>::allocator<char>
                  ((allocator<wchar_t> *)in_stack_fffffffffffffd50,
                   (allocator<char> *)in_stack_fffffffffffffd48);
        std::__cxx11::wstring::wstring<wchar_t_const*,void>
                  (this_01,(wchar_t *)this_02,&in_stack_fffffffffffffd60->_M_value,
                   (allocator<wchar_t> *)
                   CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
        std::allocator<wchar_t>::~allocator(&local_a9);
        std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
        basic_regex<std::char_traits<wchar_t>,std::allocator<wchar_t>>(this_00,__s,__f);
        local_168 = std::__cxx11::wstring::begin();
        __gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>::
        __normal_iterator<wchar_t*>
                  ((__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                    *)in_stack_fffffffffffffd50,
                   (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                    *)in_stack_fffffffffffffd48);
        local_178 = std::__cxx11::wstring::end();
        __gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>::
        __normal_iterator<wchar_t*>
                  ((__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                    *)in_stack_fffffffffffffd50,
                   (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                    *)in_stack_fffffffffffffd48);
        std::__cxx11::
        regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
        ::regex_token_iterator
                  (this_03,__a,in_RSI,(regex_type *)in_RDI,(int)((ulong)args_00 >> 0x20),
                   (match_flag_type)args_00);
        std::__cxx11::
        regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
        ::regex_token_iterator(in_stack_fffffffffffffd50);
        local_201 = 0;
        basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                  ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDI,0,
                   in_RSI._M_current + 6);
        while (bVar1 = std::__cxx11::
                       regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                       ::operator!=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48), bVar1) {
          in_stack_fffffffffffffd50 =
               (regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                *)std::__cxx11::
                  regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                  ::operator*(&local_158);
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          ::str((sub_match<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)__s);
          std::__cxx11::wstring::c_str();
          basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
          emplace_back<wchar_t_const*,jsoncons::semantic_tag>
                    ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDI,
                     (wchar_t **)args_00,args_1);
          std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
          ::operator++(in_stack_ffffffffffffff30);
          std::__cxx11::wstring::~wstring(local_228);
        }
        local_201 = 1;
        std::__cxx11::
        regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
        ::~regex_token_iterator(in_stack_fffffffffffffd50);
        std::__cxx11::
        regex_token_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
        ::~regex_token_iterator(in_stack_fffffffffffffd50);
        std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex
                  ((basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)
                   in_stack_fffffffffffffd50);
        std::__cxx11::wstring::~wstring(local_a8);
        std::__cxx11::wstring::~wstring(local_70);
        uVar4 = extraout_RDX_01;
        goto LAB_006285d1;
      }
    }
    std::error_code::operator=(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_fffffffffffffd50,
               (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_fffffffffffffd48);
    uVar4 = extraout_RDX_00;
  }
  else {
    std::error_code::operator=(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_fffffffffffffd50,
               (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_fffffffffffffd48);
    uVar4 = extraout_RDX;
  }
LAB_006285d1:
  vVar6.field_0.int64_.val_ = uVar4;
  vVar6.field_0._0_8_ = this_03;
  return (value_type)vVar6.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            if (!args[0].value().is_string() || !args[1].value().is_string())
            {
                //std::cout << "arg: " << arg0 << "\n";
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }
            auto arg0 = args[0].value().template as<string_view_type>();
            auto arg1 = args[1].value().template as<string_view_type>();

            auto s0 = string_type(arg0.begin(), arg0.end(), alloc_);
            auto s1 = string_type(arg1.begin(), arg1.end(), alloc_);

            std::regex::flag_type options = std::regex_constants::ECMAScript; 
            std::basic_regex<char_type> pieces_regex(s1, options);

            std::regex_token_iterator<typename string_type::const_iterator> rit ( s0.begin(), s0.end(), pieces_regex, -1);
            std::regex_token_iterator<typename string_type::const_iterator> rend;

            value_type j(json_array_arg, semantic_tag::none, alloc_);
            while (rit != rend) 
            {
                auto s = (*rit).str();
                j.emplace_back(s.c_str(), semantic_tag::none);
                ++rit;
            }
            return j;
        }